

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_9::DiskHandle::WritableFileMappingImpl::changed
          (WritableFileMappingImpl *this,ArrayPtr<unsigned_char> slice)

{
  bool bVar1;
  int osErrorNumber;
  uchar *puVar2;
  size_t sVar3;
  uchar *puVar4;
  void *pvVar5;
  bool local_a9;
  Fault local_a8;
  Fault f_1;
  SyscallResult local_94;
  undefined1 auStack_90 [4];
  SyscallResult _kjSyscallResult;
  MmapRange range;
  Fault local_70;
  Fault f;
  uchar *local_60;
  ArrayDisposer *local_58;
  DebugComparison<unsigned_char_*,_const_unsigned_char_*> local_50;
  bool local_21;
  WritableFileMappingImpl *pWStack_20;
  bool _kjCondition;
  WritableFileMappingImpl *this_local;
  ArrayPtr<unsigned_char> slice_local;
  
  slice_local.ptr = (uchar *)slice.size_;
  this_local = (WritableFileMappingImpl *)slice.ptr;
  pWStack_20 = this;
  local_60 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
  local_58 = (ArrayDisposer *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_60);
  f.exception = (Exception *)Array<unsigned_char>::begin(&this->bytes);
  kj::_::DebugExpression<unsigned_char*>::operator>=
            (&local_50,(DebugExpression<unsigned_char*> *)&local_58,(uchar **)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_50);
  local_a9 = false;
  if (bVar1) {
    puVar4 = ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)&this_local);
    puVar2 = Array<unsigned_char>::end(&this->bytes);
    local_a9 = puVar4 <= puVar2;
  }
  local_21 = local_a9;
  if (local_a9 == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[39]>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x1db,FAILED,"slice.begin() >= bytes.begin() && slice.end() <= bytes.end()",
               "_kjCondition,\"byte range is not part of this mapping\"",&local_21,
               (char (*) [39])"byte range is not part of this mapping");
    kj::_::Debug::Fault::fatal(&local_70);
  }
  sVar3 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
  if (sVar3 != 0) {
    puVar4 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
    sVar3 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
    _auStack_90 = getMmapRange((uint64_t)puVar4,sVar3);
    f_1.exception = (Exception *)auStack_90;
    local_94 = kj::_::Debug::
               syscall<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl::changed(kj::ArrayPtr<unsigned_char>)const::_lambda()_1_>
                         ((anon_class_8_1_a88e285d *)&f_1,false);
    pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_94);
    if (pvVar5 == (void *)0x0) {
      osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_94);
      kj::_::Debug::Fault::Fault
                (&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x1e0,osErrorNumber,
                 "msync(reinterpret_cast<void*>(range.offset), range.size, MS_ASYNC)","");
      kj::_::Debug::Fault::fatal(&local_a8);
    }
  }
  return;
}

Assistant:

void changed(ArrayPtr<byte> slice) const override {
      KJ_REQUIRE(slice.begin() >= bytes.begin() && slice.end() <= bytes.end(),
                 "byte range is not part of this mapping");
      if (slice.size() == 0) return;

      // msync() requires page-alignment, apparently, so use getMmapRange() to accomplish that.
      auto range = getMmapRange(reinterpret_cast<uintptr_t>(slice.begin()), slice.size());
      KJ_SYSCALL(msync(reinterpret_cast<void*>(range.offset), range.size, MS_ASYNC));
    }